

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderMaxAtomicCounterBuffersTest::iterate
          (GeometryShaderMaxAtomicCounterBuffersTest *this)

{
  GLint *pGVar1;
  ostringstream *poVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  undefined4 extraout_var;
  NotSupportedError *pNVar8;
  GLuint *pGVar9;
  int *piVar10;
  char *description;
  uint uVar11;
  qpTestResult testResult;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  char *__end;
  bool has_shader_compilation_failed;
  GLint *local_240;
  uint local_238;
  GLuint initial_ac_data;
  char *gs_code_specialized_raw;
  string gs_code_specialized;
  char *fs_code_specialized_raw;
  string fs_code_specialized;
  string vs_code_specialized;
  char *vs_code_specialized_raw;
  char *vs_code;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  long lVar7;
  
  vs_code = 
  "${VERSION}\n\nflat out int vertex_id;\n\nvoid main()\n{\n    vertex_id    = gl_VertexID;\n    gl_Position  = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
  ;
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  has_shader_compilation_failed = true;
  initial_ac_data = 0;
  uVar13 = this->m_gl_max_geometry_atomic_counter_buffers_ext_value;
  fs_code_specialized._M_dataplus._M_p = (pointer)&fs_code_specialized.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&fs_code_specialized,0x1b32ab9,0x1b32ab9);
  fs_code_specialized_raw = (char *)0x0;
  gs_code_specialized._M_dataplus._M_p = (pointer)&gs_code_specialized.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gs_code_specialized,0x1b32ab9,0x1b32ab9);
  gs_code_specialized_raw = (char *)0x0;
  vs_code_specialized._M_dataplus._M_p = (pointer)&vs_code_specialized.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vs_code_specialized,0x1b32ab9);
  vs_code_specialized_raw = (char *)0x0;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar8,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
               ,0xa2b);
    __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_240 = &this->m_gl_max_geometry_atomic_counter_buffers_ext_value;
  (**(code **)(lVar7 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,
                  "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xa31);
  pGVar1 = &this->m_gl_max_atomic_counter_buffer_bindings_value;
  (**(code **)(lVar7 + 0x868))(0x92dc,pGVar1);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGetIntegerv() failed for GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                  ,0xa35);
  if (*local_240 < 1) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT query value ",0x37);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[",1);
    std::ostream::operator<<(poVar2,*local_240);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               "] is less than or equal to zero. Atomic Counter Buffers are not supported.",0x4a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_138);
    if (*local_240 == 0) {
      pNVar8 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT is 0","");
      tcu::NotSupportedError::NotSupportedError(pNVar8,(string *)local_1b0);
      __cxa_throw(pNVar8,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  else {
    if (*pGVar1 < *local_240) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT query value ",0x37);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[",1);
      std::ostream::operator<<(poVar2,*local_240);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "] is greater than GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS query value [",0x45);
      std::ostream::operator<<(poVar2,*pGVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"].",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      GVar6 = (**(code **)(lVar7 + 0x3c8))();
      this->m_po_id = GVar6;
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glCreateProgram() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0xa5c);
      GVar6 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
      this->m_fs_id = GVar6;
      GVar6 = (**(code **)(lVar7 + 0x3f0))(0x8dd9);
      this->m_gs_id = GVar6;
      GVar6 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
      this->m_vs_id = GVar6;
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"glCreateShader() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                      ,0xa63);
      TestCaseBase::specializeShader_abi_cxx11_
                ((string *)local_1b0,&this->super_TestCaseBase,1,&dummy_fs_code);
      std::__cxx11::string::operator=((string *)&fs_code_specialized,(string *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
      getGSCode_abi_cxx11_((string *)local_1b0,this);
      std::__cxx11::string::operator=((string *)&gs_code_specialized,(string *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      gs_code_specialized_raw = gs_code_specialized._M_dataplus._M_p;
      TestCaseBase::specializeShader_abi_cxx11_
                ((string *)local_1b0,&this->super_TestCaseBase,1,&vs_code);
      std::__cxx11::string::operator=((string *)&vs_code_specialized,(string *)local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
      }
      vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
      bVar3 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_po_id,this->m_gs_id,1,
                         &gs_code_specialized_raw,this->m_vs_id,1,&vs_code_specialized_raw,
                         this->m_fs_id,1,&fs_code_specialized_raw,&has_shader_compilation_failed);
      if (bVar3) {
        iVar4 = *local_240;
        uVar15 = 0xffffffffffffffff;
        if (-1 < (long)iVar4) {
          uVar15 = (long)iVar4 * 4;
        }
        pGVar9 = (GLuint *)operator_new__(uVar15);
        this->m_acbo_ids = pGVar9;
        (**(code **)(lVar7 + 0x6c8))(iVar4,pGVar9);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGenBuffers() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xa7e);
        local_238 = uVar13;
        if (0 < *local_240) {
          uVar15 = 0;
          do {
            (**(code **)(lVar7 + 0x40))(0x92c0,this->m_acbo_ids[uVar15]);
            dVar5 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar5,"glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0xa83);
            (**(code **)(lVar7 + 0x150))(0x92c0,4,&initial_ac_data,0x88ea);
            dVar5 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar5,"glBufferData() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0xa87);
            (**(code **)(lVar7 + 0x48))(0x92c0,uVar15 & 0xffffffff,this->m_acbo_ids[uVar15]);
            dVar5 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar5,"bindBufferRange() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                            ,0xa8a);
            uVar15 = uVar15 + 1;
          } while ((long)uVar15 < (long)*local_240);
        }
        (**(code **)(lVar7 + 0x708))(1,&this->m_vao_id);
        uVar13 = local_238;
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glGenVertexArrays() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xa8f);
        (**(code **)(lVar7 + 0xd8))(this->m_vao_id);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glBindVertexArray() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xa92);
        (**(code **)(lVar7 + 0x1680))(this->m_po_id);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glUseProgram() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xa96);
        uVar11 = uVar13 << 7;
        (**(code **)(lVar7 + 0x538))(0,0,uVar11);
        dVar5 = (**(code **)(lVar7 + 0x800))();
        glu::checkError(dVar5,"glDrawArrays() call failed for GL_POINTS pname.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                        ,0xa99);
        testResult = QP_TEST_RESULT_PASS;
        iVar4 = 0;
        if ((uVar13 & 0x1ffffff) != 0) {
          uVar13 = *local_240 + 1;
          uVar12 = 2;
          if (2 < (int)uVar13) {
            uVar12 = uVar13;
          }
          uVar15 = 0;
          iVar4 = 0;
          do {
            if (0 < *local_240) {
              uVar14 = 1;
              do {
                iVar4 = iVar4 + (uint)((int)(uVar15 % uVar14) == 0);
                uVar13 = (int)uVar14 + 1;
                uVar14 = (ulong)uVar13;
              } while (uVar12 != uVar13);
            }
            uVar13 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar13;
          } while (uVar13 != uVar11);
        }
        description = "Pass";
        if (*local_240 < 1) goto LAB_00cf8e2d;
        local_238 = (uint)CONCAT71((int7)((ulong)local_240 >> 8),1);
        lVar16 = 0;
        do {
          (**(code **)(lVar7 + 0x40))(0x92c0,this->m_acbo_ids[lVar16]);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glBindBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0xaaf);
          piVar10 = (int *)(**(code **)(lVar7 + 0xd00))(0x92c0,0,4,1);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glMapBufferRange() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0xab3);
          if (*piVar10 != iVar4) {
            local_238 = 0;
            break;
          }
          (**(code **)(lVar7 + 0x1670))(0x92c0);
          dVar5 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar5,"glUnmapBuffer() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                          ,0xabc);
          lVar16 = lVar16 + 1;
        } while (lVar16 < *local_240);
        testResult = QP_TEST_RESULT_PASS;
        description = "Pass";
        if ((local_238 & 1) != 0) goto LAB_00cf8e2d;
        goto LAB_00cf8e21;
      }
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),"Program object linking failed.",0x1e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
  }
LAB_00cf8e21:
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00cf8e2d:
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_code_specialized._M_dataplus._M_p != &vs_code_specialized.field_2) {
    operator_delete(vs_code_specialized._M_dataplus._M_p,
                    vs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gs_code_specialized._M_dataplus._M_p != &gs_code_specialized.field_2) {
    operator_delete(gs_code_specialized._M_dataplus._M_p,
                    gs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_code_specialized._M_dataplus._M_p != &fs_code_specialized.field_2) {
    operator_delete(fs_code_specialized._M_dataplus._M_p,
                    fs_code_specialized.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderMaxAtomicCounterBuffersTest::iterate()
{
	/* Define Vertex Shader's code for the purpose of this test. */
	const char* vs_code = "${VERSION}\n"
						  "\n"
						  "flat out int vertex_id;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    vertex_id    = gl_VertexID;\n"
						  "    gl_Position  = vec4(1.0, 0.0, 0.0, 1.0);\n"
						  "}\n";

	unsigned int		  expected_value				= 0;
	const glw::Functions& gl							= m_context.getRenderContext().getFunctions();
	bool				  has_shader_compilation_failed = true;
	const glw::GLuint	 initial_ac_data				= 0;
	const glw::GLuint	 number_of_indices				= 128 * m_gl_max_geometry_atomic_counter_buffers_ext_value;
	bool				  result						= true;

	std::string fs_code_specialized		= "";
	const char* fs_code_specialized_raw = DE_NULL;
	std::string gs_code_specialized		= "";
	const char* gs_code_specialized_raw = DE_NULL;
	std::string vs_code_specialized		= "";
	const char* vs_code_specialized_raw = DE_NULL;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT pname value */
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,
				   &m_gl_max_geometry_atomic_counter_buffers_ext_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT pname");

	/* Retrieve GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS pname value */
	gl.getIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &m_gl_max_atomic_counter_buffer_bindings_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS pname");

	/* Check if m_gl_max_geometry_atomic_counter_buffers_ext_value is less than or equal zero. */
	if (m_gl_max_geometry_atomic_counter_buffers_ext_value <= 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT query value "
						   << "[" << m_gl_max_geometry_atomic_counter_buffers_ext_value
						   << "]"
							  " is less than or equal to zero. Atomic Counter Buffers"
							  " are not supported."
						   << tcu::TestLog::EndMessage;

		if (m_gl_max_geometry_atomic_counter_buffers_ext_value == 0)
		{
			throw tcu::NotSupportedError("GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT is 0");
		}
		else
		{
			result = false;
			goto end;
		}
	}

	/* Check if m_gl_max_atomic_counter_buffer_bindings_value is less than m_gl_max_shader_storage_blocks_value. */
	if (m_gl_max_atomic_counter_buffer_bindings_value < m_gl_max_geometry_atomic_counter_buffers_ext_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS_EXT query value "
						   << "[" << m_gl_max_geometry_atomic_counter_buffers_ext_value
						   << "]"
							  " is greater than GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS query value "
							  "["
						   << m_gl_max_atomic_counter_buffer_bindings_value << "]." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create a program object. */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Create shader objects. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	fs_code_specialized_raw = fs_code_specialized.c_str();

	gs_code_specialized		= getGSCode();
	gs_code_specialized_raw = gs_code_specialized.c_str();

	vs_code_specialized		= specializeShader(1, &vs_code);
	vs_code_specialized_raw = vs_code_specialized.c_str();

	if (!TestCaseBase::buildProgram(m_po_id, m_gs_id, 1,				  /* n_sh1_body_parts */
									&gs_code_specialized_raw, m_vs_id, 1, /* n_sh2_body_parts */
									&vs_code_specialized_raw, m_fs_id, 1, /* n_sh3_body_parts */
									&fs_code_specialized_raw, &has_shader_compilation_failed))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking failed." << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Create Atomic Counter Buffer Objects. */
	m_acbo_ids = new glw::GLuint[m_gl_max_geometry_atomic_counter_buffers_ext_value];

	gl.genBuffers(m_gl_max_geometry_atomic_counter_buffers_ext_value, m_acbo_ids);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	for (glw::GLint n_acb = 0; n_acb < m_gl_max_geometry_atomic_counter_buffers_ext_value; ++n_acb)
	{
		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_acbo_ids[n_acb]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed for GL_SHADER_STORAGE_BUFFER pname.");

		gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(glw::GLuint), &initial_ac_data /*initialize with zeroes*/,
					  GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

		gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, n_acb /*binding index*/, m_acbo_ids[n_acb] /*buffer*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bindBufferRange() call failed.");
	}

	/* Configure VAO. */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Use program. */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.drawArrays(GL_POINTS, 0 /*starting index*/, number_of_indices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed for GL_POINTS pname.");

	/* Calculate expected value. */
	/* For each point being processed by Geometry Shader. */
	for (glw::GLuint vertex_id = 0; vertex_id < number_of_indices; ++vertex_id)
	{
		/* And for each atomic counter ID. */
		for (int atomic_counter_id = 1; atomic_counter_id <= m_gl_max_geometry_atomic_counter_buffers_ext_value;
			 ++atomic_counter_id)
		{
			/* Check if (vertex_id % atomic_counter_id) == 0. If it is true, increment expected_value. */
			if (vertex_id % atomic_counter_id == 0)
			{
				++expected_value;
			}
		}
	}

	/* Retrieve values from Atomic Counter Buffer Objects and check if these values are valid. */
	for (glw::GLint n_acb = 0; n_acb < m_gl_max_geometry_atomic_counter_buffers_ext_value; ++n_acb)
	{
		gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_acbo_ids[n_acb]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

		glw::GLuint* ptrABO_data = (glw::GLuint*)gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0 /*offset*/,
																   sizeof(glw::GLuint) /*length*/, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

		if (ptrABO_data[0] != expected_value)
		{
			result = false;
			break;
		}

		gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

		ptrABO_data = NULL;
	}

end:
	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}